

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_manager.cc
# Opt level: O3

RC __thiscall QL_Manager::RunSelect(QL_Manager *this,QL_Node *topNode)

{
  RC RVar1;
  int iVar2;
  DataAttrInfo *attributes;
  char *data;
  int attrListSize;
  int finalTupLength;
  Printer printer;
  int *attrList;
  int local_68;
  int local_64;
  Printer local_60;
  int *local_38;
  
  QL_Node::GetTupleLength(topNode,&local_64);
  RVar1 = QL_Node::GetAttrList(topNode,&local_38,&local_68);
  if (RVar1 == 0) {
    attributes = (DataAttrInfo *)malloc((long)local_68 * 0x44);
    RVar1 = SetUpPrinter(this,topNode,attributes);
    if (RVar1 == 0) {
      Printer::Printer(&local_60,attributes,local_68);
      Printer::PrintHeader(&local_60,(ostream *)&std::cout);
      RVar1 = (**topNode->_vptr_QL_Node)(topNode);
      if (RVar1 == 0) {
        data = (char *)malloc((long)local_64);
        iVar2 = (*topNode->_vptr_QL_Node[1])(topNode,data);
        while (iVar2 == 0) {
          Printer::Print(&local_60,(ostream *)&std::cout,data);
          iVar2 = (*topNode->_vptr_QL_Node[1])(topNode,data);
        }
        free(data);
        RVar1 = (*topNode->_vptr_QL_Node[3])(topNode);
        if (RVar1 == 0) {
          Printer::PrintFooter(&local_60,(ostream *)&std::cout);
          free(attributes);
          RVar1 = 0;
        }
      }
      Printer::~Printer(&local_60);
    }
  }
  return RVar1;
}

Assistant:

RC QL_Manager::RunSelect(QL_Node *topNode){
  RC rc = 0;
  // Retrieve the appropriate tuples that one is supposed to
  // print out by asking for the attribute information from the top node
  int finalTupLength;
  topNode->GetTupleLength(finalTupLength);
  int *attrList;
  int attrListSize;
  if((rc = topNode->GetAttrList(attrList, attrListSize)))
    return (rc);

  // Set up the DatAttrInfo for the attributes to print
  DataAttrInfo * attributes = (DataAttrInfo *)malloc(attrListSize* sizeof(DataAttrInfo));
  if((rc = SetUpPrinter(topNode, attributes)))
    return (rc);
  Printer printer(attributes, attrListSize);
  printer.PrintHeader(cout);

  // Open the iterator of the top node, and keep retrieving elements until
  // there are no more
  if((rc = topNode->OpenIt()))
    return (rc);
  RC it_rc = 0;
  char *buffer = (char *)malloc(finalTupLength);
  it_rc = topNode->GetNext(buffer);
  while(it_rc == 0){
    printer.Print(cout, buffer);
    it_rc = topNode->GetNext(buffer);
  }

  free(buffer);
  if((rc = topNode->CloseIt()))
    return (rc);

  printer.PrintFooter(cout);

  free(attributes);

  return (0);
}